

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_case_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  CodeLocation *pCVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  bool local_3c;
  allocator local_3b;
  byte local_3a;
  allocator local_39;
  CodeLocation *local_38;
  CodeLocation *a_code_location_local;
  char *a_value_param_local;
  char *a_type_param_local;
  string *a_name_local;
  string *a_test_case_name_local;
  TestInfo *this_local;
  
  local_38 = a_code_location;
  a_code_location_local = (CodeLocation *)a_value_param;
  a_value_param_local = a_type_param;
  a_type_param_local = (char *)a_name;
  a_name_local = a_test_case_name;
  a_test_case_name_local = &this->test_case_name_;
  std::__cxx11::string::string((string *)this,(string *)a_test_case_name);
  std::__cxx11::string::string((string *)&this->name_,(string *)a_type_param_local);
  local_3a = 0;
  if (a_value_param_local == (char *)0x0) {
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    pcVar2 = a_value_param_local;
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)local_60,pcVar2,&local_39);
  }
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->type_param_,local_60);
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  local_3c = a_code_location_local == (CodeLocation *)0x0;
  if (local_3c) {
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    pCVar1 = a_code_location_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,(char *)pCVar1,&local_3b);
  }
  local_3c = !local_3c;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->value_param_,local_80);
  if (local_3c) {
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
  }
  internal::CodeLocation::CodeLocation(&this->location_,a_code_location);
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->factory_ = factory;
  TestResult::TestResult(&this->result_);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_case_name,
                   const std::string& a_name,
                   const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      value_param_(a_value_param ? new std::string(a_value_param) : NULL),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}